

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O2

void __thiscall QFbCursor::updateMouseStatus(QFbCursor *this)

{
  long lVar1;
  QFbCursor QVar2;
  long *plVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x50) == 0) {
    this[0x10] = (QFbCursor)0x0;
    plVar3 = *(long **)(this + 0x18);
  }
  else {
    QVar2 = (QFbCursor)QFbCursorDeviceListener::hasMouse((QFbCursorDeviceListener *)this);
    this[0x10] = QVar2;
    plVar3 = *(long **)(this + 0x18);
    if ((bool)QVar2) {
      getCurrentRect(this);
      goto LAB_001122cb;
    }
  }
  (**(code **)(*(long *)this + 0xb8))(this);
LAB_001122cb:
  (**(code **)(*plVar3 + 0xd0))(plVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbCursor::updateMouseStatus()
{
    mVisible = mDeviceListener ? mDeviceListener->hasMouse() : false;
    mScreen->setDirty(mVisible ? getCurrentRect() : lastPainted());
}